

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encode.c
# Opt level: O1

int EncodeData(BrotliEncoderState *s,int is_last,int force_flush,size_t *out_size,uint8_t **output)

{
  MemoryManager *m;
  undefined1 *puVar1;
  byte bVar2;
  uint8_t uVar3;
  uint uVar4;
  H42 *pHVar5;
  H2 *pHVar6;
  H6 *pHVar7;
  H4 *pHVar8;
  H5 *pHVar9;
  H9 *pHVar10;
  H3 *pHVar11;
  H7 *pHVar12;
  H10 *pHVar13;
  uint64_t uVar14;
  uint64_t uVar15;
  H42 *pHVar16;
  undefined8 uVar17;
  int iVar18;
  int iVar19;
  ulong ringbuffer_mask;
  uint32_t *puVar20;
  uint8_t *puVar21;
  int *table;
  ulong uVar22;
  Command *pCVar23;
  H54 *pHVar24;
  H8 *pHVar25;
  uint16_t *puVar26;
  H41 *pHVar27;
  char cVar28;
  uint uVar29;
  uint uVar30;
  uint *puVar31;
  ulong uVar32;
  char *pcVar33;
  Command *pCVar34;
  void *__s2;
  BrotliEncoderParams *pBVar35;
  ushort uVar36;
  ushort uVar37;
  undefined4 in_register_00000034;
  uint8_t *input;
  size_t sVar38;
  ushort uVar39;
  long lVar40;
  ulong uVar41;
  BrotliEncoderParams *pBVar42;
  BrotliEncoderState *pBVar43;
  BrotliEncoderParams *pBVar44;
  uint uVar45;
  size_t *psVar46;
  ulong uVar47;
  size_t sVar48;
  long lVar49;
  BrotliEncoderState *pBVar50;
  ulong uVar51;
  bool bVar52;
  ContextType literal_context_mode;
  size_t storage_ix_1;
  ulong local_198;
  Command *local_190;
  size_t *local_188;
  ulong local_180;
  int *local_178;
  Command *local_170;
  ulong local_168;
  int *local_160;
  ulong local_158;
  Hashers *local_150;
  size_t table_size;
  BrotliEncoderParams *local_140;
  size_t *local_138;
  ulong local_130;
  uint8_t **local_128;
  uint32_t *local_120;
  ulong local_118;
  size_t storage_ix;
  BlockSplit local_e0;
  BlockSplit local_b0;
  uint32_t *local_80;
  size_t sStack_78;
  uint32_t *local_70;
  size_t sStack_68;
  HistogramLiteral *local_60;
  size_t sStack_58;
  HistogramCommand *local_50;
  size_t sStack_48;
  HistogramDistance *local_40;
  size_t sStack_38;
  
  sVar48 = CONCAT44(in_register_00000034,is_last);
  uVar22 = s->last_processed_pos_;
  local_160 = (int *)CONCAT44(local_160._4_4_,force_flush);
  uVar45 = (uint)uVar22;
  if (2 < uVar22 >> 0x1e) {
    uVar45 = ((int)(uVar45 * 2) >> 1 & 0xc0000000U) + (uVar45 & 0x3fffffff) + 0x80000000;
  }
  uVar32 = s->input_pos_;
  EnsureInitialized(s);
  if (s->is_last_block_emitted_ != 0) {
    return 0;
  }
  uVar47 = uVar32 - uVar22;
  if (is_last != 0) {
    s->is_last_block_emitted_ = 1;
  }
  uVar4 = (s->ringbuffer_).mask_;
  ringbuffer_mask = (ulong)uVar4;
  pHVar5 = (H42 *)(s->ringbuffer_).buffer_;
  local_128 = output;
  EnsureInitialized(s);
  if ((ulong)(1L << ((byte)(s->params).lgblock & 0x3f)) < uVar47) {
    return 0;
  }
  m = &s->memory_manager_;
  if (((s->params).quality == 1) && (s->command_buf_ == (uint32_t *)0x0)) {
    puVar20 = (uint32_t *)BrotliAllocate(m,0x80000);
    s->command_buf_ = puVar20;
    puVar21 = (uint8_t *)BrotliAllocate(m,0x20000);
    s->literal_buf_ = puVar21;
  }
  uVar29 = (uint)uVar47;
  if ((uint)(s->params).quality < 2) {
    storage_ix = (size_t)s->last_byte_bits_;
    if (is_last == 0 && uVar32 == uVar22) {
      sVar48 = 0;
    }
    else {
      puVar21 = GetBrotliStorage(s,(ulong)(uVar29 * 2 + 0x1f6));
      *puVar21 = s->last_byte_;
      uVar47 = uVar47 & 0xffffffff;
      table = GetHashTable(s,(s->params).quality,uVar47,&table_size);
      input = (uint8_t *)((long)pHVar5->addr + (ulong)(uVar45 & uVar4));
      if ((s->params).quality == 0) {
        BrotliCompressFragmentFast
                  (m,input,uVar47,is_last,table,table_size,s->cmd_depths_,s->cmd_bits_,
                   &s->cmd_code_numbits_,s->cmd_code_,&storage_ix,puVar21);
      }
      else {
        BrotliCompressFragmentTwoPass
                  (m,input,uVar47,is_last,s->command_buf_,s->literal_buf_,table,table_size,
                   &storage_ix,puVar21);
      }
      sVar48 = storage_ix >> 3;
      s->last_byte_ = puVar21[sVar48];
      s->last_byte_bits_ = (byte)storage_ix & 7;
      UpdateLastProcessedPos(s);
      *local_128 = puVar21;
    }
    *out_size = sVar48;
    return 1;
  }
  uVar22 = s->num_commands_ + (uVar47 >> 1 & 0x7fffffff) + 1;
  if (s->cmd_alloc_size_ < uVar22) {
    sVar38 = (uVar47 >> 2 & 0x3fffffff) + uVar22 + 0x10;
    s->cmd_alloc_size_ = sVar38;
    if (sVar38 == 0) {
      pCVar23 = (Command *)0x0;
    }
    else {
      pCVar23 = (Command *)BrotliAllocate(m,sVar38 * 0x10);
    }
    if (s->commands_ != (Command *)0x0) {
      memcpy(pCVar23,s->commands_,s->num_commands_ << 4);
      BrotliFree(m,s->commands_);
      s->commands_ = (Command *)0x0;
    }
    s->commands_ = pCVar23;
  }
  pBVar44 = (BrotliEncoderParams *)(ulong)uVar45;
  uVar47 = uVar47 & 0xffffffff;
  iVar19 = (s->params).quality;
  iVar18 = 10;
  if (((iVar19 < 10) &&
      (((iVar19 != 4 || (iVar18 = 0x36, (s->params).size_hint < 0x100000)) &&
       (iVar18 = iVar19, 4 < iVar19)))) && ((s->params).lgwin < 0x11)) {
    iVar18 = 0x28;
    if (6 < iVar19) {
      iVar18 = (iVar19 == 9) + 0x29;
    }
  }
  local_150 = &s->hashers_;
  iVar19 = (int)s;
  pBVar43 = s;
  if (iVar18 < 0x28) {
    switch(iVar18) {
    case 2:
      pHVar6 = local_150->h2;
      if (((is_last == 0) || (0x800 < uVar29)) || (uVar45 != 0)) {
        if (pHVar6->is_dirty_ != 0) {
          memset(pHVar6,0,0x40008);
        }
      }
      else if (uVar47 != 0) {
        uVar22 = 0;
        do {
          pHVar6->buckets_
          [(ulong)(*(long *)((long)pHVar5->addr + uVar22) * -0x42e1ca5843000000) >> 0x30] = 0;
          uVar22 = uVar22 + 1;
        } while (uVar47 != uVar22);
        pHVar6->is_dirty_ = 0;
      }
      pBVar43 = s;
      if ((6 < uVar29) && (2 < uVar45)) {
        pHVar6 = local_150->h2;
        pHVar6->buckets_
        [(ulong)(*(long *)((long)pHVar5->addr + (ulong)(uVar45 - 3 & uVar4)) * -0x42e1ca5843000000)
         >> 0x30] = uVar45 - 3;
        pHVar6->buckets_
        [(ulong)(*(long *)((long)pHVar5->addr + (ulong)(uVar45 - 2 & uVar4)) * -0x42e1ca5843000000)
         >> 0x30] = uVar45 - 2;
        pHVar6->buckets_
        [(ulong)(*(long *)((long)pHVar5->addr + (ulong)(uVar45 - 1 & uVar4)) * -0x42e1ca5843000000)
         >> 0x30] = uVar45 - 1;
      }
      break;
    case 3:
      pHVar11 = (s->hashers_).h3;
      if (((is_last == 0) || (0x800 < uVar29)) || (uVar45 != 0)) {
        if (pHVar11->is_dirty_ != 0) {
          memset(pHVar11,0,0x4000c);
        }
      }
      else if (uVar47 != 0) {
        uVar22 = 0;
        do {
          lVar49 = *(long *)((long)pHVar5->addr + uVar22);
          (pHVar11->buckets_ + ((ulong)(lVar49 * -0x42e1ca5843000000) >> 0x30))[0] = 0;
          (pHVar11->buckets_ + ((ulong)(lVar49 * -0x42e1ca5843000000) >> 0x30))[1] = 0;
          uVar22 = uVar22 + 1;
        } while (uVar47 != uVar22);
        pHVar11->is_dirty_ = 0;
      }
      pBVar43 = s;
      if ((6 < uVar29) && (2 < uVar45)) {
        pHVar11 = (s->hashers_).h3;
        uVar29 = uVar45 - 3;
        *(uint *)((long)pHVar11->buckets_ +
                 (ulong)(((uint)(ushort)((ulong)(*(long *)((long)pHVar5->addr +
                                                          (ulong)(uVar29 & uVar4)) *
                                                -0x42e1ca5843000000) >> 0x30) +
                         (uint)((uVar29 >> 3 & 1) != 0)) * 4)) = uVar29;
        uVar29 = uVar45 - 2;
        *(uint *)((long)pHVar11->buckets_ +
                 (ulong)(((uint)(ushort)((ulong)(*(long *)((long)pHVar5->addr +
                                                          (ulong)(uVar29 & uVar4)) *
                                                -0x42e1ca5843000000) >> 0x30) +
                         (uint)((uVar29 >> 3 & 1) != 0)) * 4)) = uVar29;
        uVar45 = uVar45 - 1;
        *(uint *)((long)pHVar11->buckets_ +
                 (ulong)(((uint)(ushort)((ulong)(*(long *)((long)pHVar5->addr +
                                                          (ulong)(uVar45 & uVar4)) *
                                                -0x42e1ca5843000000) >> 0x30) +
                         (uint)((uVar45 >> 3 & 1) != 0)) * 4)) = uVar45;
      }
      break;
    case 4:
      pHVar8 = (s->hashers_).h4;
      if (((is_last == 0) || (0x1000 < uVar29)) || (uVar45 != 0)) {
        if (pHVar8->is_dirty_ != 0) {
          memset(pHVar8,0,0x80014);
        }
      }
      else if (uVar47 != 0) {
        uVar22 = 0;
        do {
          puVar20 = pHVar8->buckets_ +
                    ((ulong)(*(long *)((long)pHVar5->addr + uVar22) * -0x42e1ca5843000000) >> 0x2f);
          puVar20[0] = 0;
          puVar20[1] = 0;
          puVar20[2] = 0;
          puVar20[3] = 0;
          uVar22 = uVar22 + 1;
        } while (uVar47 != uVar22);
        pHVar8->is_dirty_ = 0;
      }
      pBVar43 = s;
      if ((6 < uVar29) && (2 < uVar45)) {
        pHVar24 = (H54 *)(s->hashers_).h4;
        uVar29 = uVar45 - 3;
        pHVar24->buckets_
        [(uint)((ulong)(*(long *)((long)pHVar5->addr + (ulong)(uVar29 & uVar4)) *
                       -0x42e1ca5843000000) >> 0x2f) + (uVar29 >> 3 & 3)] = uVar29;
        uVar29 = uVar45 - 2;
        pHVar24->buckets_
        [(uint)((ulong)(*(long *)((long)pHVar5->addr + (ulong)(uVar29 & uVar4)) *
                       -0x42e1ca5843000000) >> 0x2f) + (uVar29 >> 3 & 3)] = uVar29;
        uVar29 = (uint)((ulong)(*(long *)((long)pHVar5->addr + (ulong)(uVar45 - 1 & uVar4)) *
                               -0x42e1ca5843000000) >> 0x2f);
LAB_0012f096:
        pHVar24->buckets_[uVar29 + (uVar45 - 1 >> 3 & 3)] = uVar45 - 1;
        pBVar43 = s;
      }
      break;
    case 5:
      pHVar9 = (s->hashers_).h5;
      if (((is_last == 0) || (0x100 < uVar29)) || (uVar45 != 0)) {
        if (pHVar9->is_dirty_ != 0) {
          memset(pHVar9,0,0x8000);
          goto LAB_0012ed03;
        }
      }
      else if (uVar47 != 0) {
        uVar22 = 0;
        do {
          pHVar9->num_[(uint)(*(int *)((long)pHVar5->addr + uVar22) * 0x1e35a7bd) >> 0x12] = 0;
          uVar22 = uVar22 + 1;
        } while (uVar47 != uVar22);
LAB_0012ed03:
        pHVar9->is_dirty_ = 0;
      }
      pBVar43 = s;
      if ((2 < uVar29) && (2 < uVar45)) {
        pHVar25 = (H8 *)(s->hashers_).h5;
        uVar29 = (uint)(*(int *)((long)pHVar5->addr + (ulong)(uVar45 - 3 & uVar4)) * 0x1e35a7bd) >>
                 0x12;
        uVar37 = pHVar25->num_[uVar29];
        *(uint *)((long)pHVar25->num_ + (ulong)(uVar29 * 0x40 + (uVar37 & 0xf) * 4) + 0x8000) =
             uVar45 - 3;
        pHVar25->num_[uVar29] = uVar37 + 1;
        uVar29 = (uint)(*(int *)((long)pHVar5->addr + (ulong)(uVar45 - 2 & uVar4)) * 0x1e35a7bd) >>
                 0x12;
        uVar37 = pHVar25->num_[uVar29];
        *(uint *)((long)pHVar25->num_ + (ulong)(uVar29 * 0x40 + (uVar37 & 0xf) * 4) + 0x8000) =
             uVar45 - 2;
        pHVar25->num_[uVar29] = uVar37 + 1;
        uVar29 = (uint)(*(int *)((long)pHVar5->addr + (ulong)(uVar45 - 1 & uVar4)) * 0x1e35a7bd) >>
                 0x12;
        uVar22 = (ulong)uVar29;
        uVar37 = pHVar25->num_[uVar22];
        uVar30 = uVar37 & 0xf;
        iVar19 = uVar29 << 6;
LAB_0012edb9:
        *(uint *)((long)pHVar25->num_ + (ulong)(iVar19 + uVar30 * 4) + 0x8000) = uVar45 - 1;
LAB_0012f26a:
        pHVar25->num_[uVar22] = uVar37 + 1;
        pBVar43 = s;
      }
      break;
    case 6:
      pHVar7 = (s->hashers_).h6;
      if (((is_last == 0) || (0x100 < uVar29)) || (uVar45 != 0)) {
        if (pHVar7->is_dirty_ != 0) {
          memset(pHVar7,0,0x8000);
          goto LAB_0012eb85;
        }
      }
      else if (uVar47 != 0) {
        uVar22 = 0;
        do {
          pHVar7->num_[(uint)(*(int *)((long)pHVar5->addr + uVar22) * 0x1e35a7bd) >> 0x12] = 0;
          uVar22 = uVar22 + 1;
        } while (uVar47 != uVar22);
LAB_0012eb85:
        pHVar7->is_dirty_ = 0;
      }
      pBVar43 = s;
      if ((2 < uVar29) && (2 < uVar45)) {
        pHVar25 = (H8 *)(s->hashers_).h6;
        uVar29 = (uint)(*(int *)((long)pHVar5->addr + (ulong)(uVar45 - 3 & uVar4)) * 0x1e35a7bd) >>
                 0x12;
        uVar37 = pHVar25->num_[uVar29];
        *(uint *)((long)pHVar25->num_ + (ulong)(uVar29 * 0x80 + (uVar37 & 0x1f) * 4) + 0x8000) =
             uVar45 - 3;
        pHVar25->num_[uVar29] = uVar37 + 1;
        uVar29 = (uint)(*(int *)((long)pHVar5->addr + (ulong)(uVar45 - 2 & uVar4)) * 0x1e35a7bd) >>
                 0x12;
        uVar37 = pHVar25->num_[uVar29];
        *(uint *)((long)pHVar25->num_ + (ulong)(uVar29 * 0x80 + (uVar37 & 0x1f) * 4) + 0x8000) =
             uVar45 - 2;
        pHVar25->num_[uVar29] = uVar37 + 1;
        uVar29 = (uint)(*(int *)((long)pHVar5->addr + (ulong)(uVar45 - 1 & uVar4)) * 0x1e35a7bd) >>
                 0x12;
        uVar22 = (ulong)uVar29;
        uVar37 = pHVar25->num_[uVar22];
        uVar30 = uVar37 & 0x1f;
        iVar19 = uVar29 << 7;
        goto LAB_0012edb9;
      }
      break;
    case 7:
      pHVar12 = (s->hashers_).h7;
      if (((is_last == 0) || (0x200 < uVar29)) || (uVar45 != 0)) {
        if (pHVar12->is_dirty_ != 0) {
          memset(pHVar12,0,0x10000);
          goto LAB_0012f0cb;
        }
      }
      else if (uVar47 != 0) {
        uVar22 = 0;
        do {
          pHVar12->num_[(uint)(*(int *)((long)pHVar5->addr + uVar22) * 0x1e35a7bd) >> 0x11] = 0;
          uVar22 = uVar22 + 1;
        } while (uVar47 != uVar22);
LAB_0012f0cb:
        pHVar12->is_dirty_ = 0;
      }
      pBVar43 = s;
      if ((2 < uVar29) && (2 < uVar45)) {
        pHVar25 = (H8 *)(s->hashers_).h7;
        uVar29 = (uint)(*(int *)((long)pHVar5->addr + (ulong)(uVar45 - 3 & uVar4)) * 0x1e35a7bd) >>
                 0x11;
        uVar37 = pHVar25->num_[uVar29];
        *(uint *)((long)pHVar25->buckets_ + (ulong)(uVar29 * 0x100 + (uVar37 & 0x3f) * 4)) =
             uVar45 - 3;
        pHVar25->num_[uVar29] = uVar37 + 1;
        uVar29 = (uint)(*(int *)((long)pHVar5->addr + (ulong)(uVar45 - 2 & uVar4)) * 0x1e35a7bd) >>
                 0x11;
        uVar37 = pHVar25->num_[uVar29];
        *(uint *)((long)pHVar25->buckets_ + (ulong)(uVar29 * 0x100 + (uVar37 & 0x3f) * 4)) =
             uVar45 - 2;
        pHVar25->num_[uVar29] = uVar37 + 1;
        uVar29 = (uint)(*(int *)((long)pHVar5->addr + (ulong)(uVar45 - 1 & uVar4)) * 0x1e35a7bd) >>
                 0x11;
        uVar22 = (ulong)uVar29;
        uVar37 = pHVar25->num_[uVar22];
        uVar30 = uVar37 & 0x3f;
        iVar19 = uVar29 << 8;
LAB_0012f25f:
        *(uint *)((long)pHVar25->buckets_ + (ulong)(iVar19 + uVar30 * 4)) = uVar45 - 1;
        goto LAB_0012f26a;
      }
      break;
    case 8:
      pHVar25 = (s->hashers_).h8;
      if (((is_last == 0) || (0x200 < uVar29)) || (uVar45 != 0)) {
        if (pHVar25->is_dirty_ != 0) {
          memset(pHVar25,0,0x10000);
          goto LAB_0012f1a9;
        }
      }
      else if (uVar47 != 0) {
        uVar22 = 0;
        do {
          pHVar25->num_[(uint)(*(int *)((long)pHVar5->addr + uVar22) * 0x1e35a7bd) >> 0x11] = 0;
          uVar22 = uVar22 + 1;
        } while (uVar47 != uVar22);
LAB_0012f1a9:
        pHVar25->is_dirty_ = 0;
      }
      pBVar43 = s;
      if ((2 < uVar29) && (2 < uVar45)) {
        pHVar25 = (s->hashers_).h8;
        uVar29 = (uint)(*(int *)((long)pHVar5->addr + (ulong)(uVar45 - 3 & uVar4)) * 0x1e35a7bd) >>
                 0x11;
        uVar37 = pHVar25->num_[uVar29];
        *(uint *)((long)pHVar25->buckets_ + (ulong)(uVar29 * 0x200 + (uVar37 & 0x7f) * 4)) =
             uVar45 - 3;
        pHVar25->num_[uVar29] = uVar37 + 1;
        uVar29 = (uint)(*(int *)((long)pHVar5->addr + (ulong)(uVar45 - 2 & uVar4)) * 0x1e35a7bd) >>
                 0x11;
        uVar37 = pHVar25->num_[uVar29];
        *(uint *)((long)pHVar25->buckets_ + (ulong)(uVar29 * 0x200 + (uVar37 & 0x7f) * 4)) =
             uVar45 - 2;
        pHVar25->num_[uVar29] = uVar37 + 1;
        uVar29 = (uint)(*(int *)((long)pHVar5->addr + (ulong)(uVar45 - 1 & uVar4)) * 0x1e35a7bd) >>
                 0x11;
        uVar22 = (ulong)uVar29;
        uVar37 = pHVar25->num_[uVar22];
        uVar30 = uVar37 & 0x7f;
        iVar19 = uVar29 << 9;
        goto LAB_0012f25f;
      }
      break;
    case 9:
      pHVar10 = (s->hashers_).h9;
      if (((is_last == 0) || (0x200 < uVar29)) || (uVar45 != 0)) {
        if (pHVar10->is_dirty_ != 0) {
          memset(pHVar10,0,0x10000);
          goto LAB_0012edec;
        }
      }
      else if (uVar47 != 0) {
        uVar22 = 0;
        do {
          pHVar10->num_[(uint)(*(int *)((long)pHVar5->addr + uVar22) * 0x1e35a7bd) >> 0x11] = 0;
          uVar22 = uVar22 + 1;
        } while (uVar47 != uVar22);
LAB_0012edec:
        pHVar10->is_dirty_ = 0;
      }
      pBVar43 = s;
      if ((2 < uVar29) && (2 < uVar45)) {
        pHVar10 = (s->hashers_).h9;
        uVar29 = (uint)(*(int *)((long)pHVar5->addr + (ulong)(uVar45 - 3 & uVar4)) * 0x1e35a7bd) >>
                 0x11;
        uVar37 = pHVar10->num_[uVar29];
        *(uint *)((long)pHVar10->buckets_ + (ulong)(uVar29 * 0x400 + (uVar37 & 0xff) * 4)) =
             uVar45 - 3;
        pHVar10->num_[uVar29] = uVar37 + 1;
        uVar29 = (uint)(*(int *)((long)pHVar5->addr + (ulong)(uVar45 - 2 & uVar4)) * 0x1e35a7bd) >>
                 0x11;
        uVar37 = pHVar10->num_[uVar29];
        *(uint *)((long)pHVar10->buckets_ + (ulong)(uVar29 * 0x400 + (uVar37 & 0xff) * 4)) =
             uVar45 - 2;
        pHVar10->num_[uVar29] = uVar37 + 1;
        uVar29 = (uint)(*(int *)((long)pHVar5->addr + (ulong)(uVar45 - 1 & uVar4)) * 0x1e35a7bd) >>
                 0x11;
        uVar37 = pHVar10->num_[uVar29];
        *(uint *)((long)pHVar10->buckets_ + (ulong)(uVar29 * 0x400 + (uVar37 & 0xff) * 4)) =
             uVar45 - 1;
        pHVar10->num_[uVar29] = uVar37 + 1;
      }
      break;
    case 10:
      InitH10(m,(s->hashers_).h10,(uint8_t *)s,pBVar44,uVar47,sVar48,iVar19);
      pBVar43 = s;
      if ((2 < uVar47) && (0x7f < uVar45)) {
        pBVar42 = (BrotliEncoderParams *)((long)&pBVar44[-4].mode + 1);
        local_140 = (BrotliEncoderParams *)((long)pBVar44 + (uVar47 - 0x7f));
        if (pBVar44 < local_140) {
          local_140 = pBVar44;
        }
        if (pBVar42 < local_140) {
          pHVar13 = (s->hashers_).h10;
          local_198 = pHVar13->window_mask_;
          local_188 = out_size;
          local_158 = uVar47;
LAB_0012e8e9:
          uVar22 = (long)pBVar44 - (long)pBVar42;
          if (uVar22 < 0x10) {
            uVar22 = 0xf;
          }
          uVar22 = local_198 - uVar22;
          uVar32 = (ulong)((uint)pBVar42 & uVar4);
          local_178 = (int *)((long)pHVar5->addr + uVar32);
          uVar45 = (uint)(*(int *)((long)pHVar5->addr + uVar32) * 0x1e35a7bd) >> 0xf;
          pBVar35 = (BrotliEncoderParams *)(ulong)pHVar13->buckets_[uVar45];
          psVar46 = (size_t *)((local_198 & (ulong)pBVar42) * 2 + 1);
          uVar32 = (local_198 & (ulong)pBVar42) * 2;
          pHVar13->buckets_[uVar45] = (uint)pBVar42;
          lVar49 = 0x40;
          local_190 = (Command *)0x0;
          local_170 = (Command *)0x0;
          local_180 = uVar22;
LAB_0012e95c:
          if ((pBVar42 != pBVar35) &&
             (lVar49 != 0 && (ulong)((long)pBVar42 - (long)pBVar35) <= uVar22)) {
            pCVar23 = local_170;
            if (local_190 < local_170) {
              pCVar23 = local_190;
            }
            if ((Command *)0x80 < pCVar23) {
              __assert_fail("cur_len <= MAX_TREE_COMP_LENGTH",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/brezza92[P]brotli/enc/./././hash_to_binary_tree_inc.h"
                            ,0x9d,
                            "BackwardMatch *StoreAndFindMatchesH10(H10 *, const uint8_t *const restrict, const size_t, const size_t, const size_t, const size_t, size_t *const restrict, BackwardMatch *restrict)"
                           );
            }
            uVar45 = (uint)pBVar35;
            __s2 = (void *)((long)pHVar5->addr + (ulong)(uVar45 & uVar4));
            pcVar33 = (char *)((long)__s2 + (long)pCVar23);
            uVar22 = 0x80 - (long)pCVar23;
            if (pCVar23 < (Command *)0x79) {
              uVar51 = (ulong)((uint)uVar22 & 0xf8);
              lVar40 = 0;
              uVar47 = 0;
LAB_0012ea07:
              uVar41 = *(ulong *)((long)local_178 + (long)pCVar23 + uVar47 * 8);
              if (*(ulong *)(pcVar33 + uVar47 * 8) == uVar41) goto code_r0x0012ea14;
              uVar41 = uVar41 ^ *(ulong *)(pcVar33 + uVar47 * 8);
              uVar22 = 0;
              if (uVar41 != 0) {
                for (; (uVar41 >> uVar22 & 1) == 0; uVar22 = uVar22 + 1) {
                }
              }
              uVar47 = (uVar22 >> 3 & 0x1fffffff) - lVar40;
              goto LAB_0012ea39;
            }
            uVar51 = 0;
            goto LAB_0012eb0c;
          }
          puVar20 = pHVar13->forest_;
          puVar20[uVar32] = pHVar13->invalid_pos_;
          puVar20[(long)psVar46] = pHVar13->invalid_pos_;
          bVar52 = false;
          goto LAB_0012eafc;
        }
      }
    }
  }
  else if (iVar18 < 0x2a) {
    if (iVar18 == 0x28) {
      InitH40((MemoryManager *)(s->hashers_).h40,(H40 *)pHVar5,(uint8_t *)s,pBVar44,uVar47,sVar48,
              iVar19);
      pBVar43 = s;
      if ((2 < uVar47) && (2 < uVar45)) {
        pHVar27 = (H41 *)(s->hashers_).h40;
        goto LAB_0012e34e;
      }
    }
    else if (((iVar18 == 0x29) &&
             (InitH41((MemoryManager *)(s->hashers_).h41,(H41 *)pHVar5,(uint8_t *)s,pBVar44,uVar47,
                      sVar48,iVar19), pBVar43 = s, 2 < uVar47)) && (2 < uVar45)) {
      pHVar27 = (s->hashers_).h41;
LAB_0012e34e:
      puVar1 = &pBVar44[-1].field_0x1d;
      uVar45 = (uint)(*(int *)((long)pHVar5->addr + (ulong)((uint)puVar1 & uVar4)) * 0x1e35a7bd) >>
               0x11;
      uVar37 = pHVar27->free_slot_idx[0];
      uVar39 = uVar37 + 1;
      pHVar27->free_slot_idx[0] = uVar39;
      uVar22 = (long)puVar1 - (ulong)pHVar27->addr[uVar45];
      if (0xfffe < uVar22) {
        uVar22 = 0xffff;
      }
      pHVar27->tiny_hash[(ulong)puVar1 & 0xffff] = (uint8_t)uVar45;
      pHVar27->banks[0].slots[uVar37].delta = (uint16_t)uVar22;
      pHVar27->banks[0].slots[uVar37].next = pHVar27->head[uVar45];
      pHVar27->addr[uVar45] = (uint)puVar1;
      pHVar27->head[uVar45] = uVar37;
      puVar1 = &pBVar44[-1].field_0x1e;
      uVar45 = (uint)(*(int *)((long)pHVar5->addr + (ulong)((uint)puVar1 & uVar4)) * 0x1e35a7bd) >>
               0x11;
      uVar36 = uVar37 + 2;
      pHVar27->free_slot_idx[0] = uVar36;
      uVar22 = (long)puVar1 - (ulong)pHVar27->addr[uVar45];
      pHVar27->tiny_hash[(ulong)puVar1 & 0xffff] = (uint8_t)uVar45;
      if (0xfffe < uVar22) {
        uVar22 = 0xffff;
      }
      pHVar27->banks[0].slots[uVar39].delta = (uint16_t)uVar22;
      pHVar27->banks[0].slots[uVar39].next = pHVar27->head[uVar45];
      pHVar27->addr[uVar45] = (uint)puVar1;
      pHVar27->head[uVar45] = uVar39;
      puVar1 = &pBVar44[-1].field_0x1f;
      uVar45 = (uint)(*(int *)((long)pHVar5->addr + (ulong)((uint)puVar1 & uVar4)) * 0x1e35a7bd) >>
               0x11;
      pHVar27->free_slot_idx[0] = uVar37 + 3;
      uVar22 = (long)puVar1 - (ulong)pHVar27->addr[uVar45];
      if (0xfffe < uVar22) {
        uVar22 = 0xffff;
      }
      pHVar27->tiny_hash[(ulong)puVar1 & 0xffff] = (uint8_t)uVar45;
      pHVar27->banks[0].slots[uVar36].delta = (uint16_t)uVar22;
      pHVar27->banks[0].slots[uVar36].next = pHVar27->head[uVar45];
      pHVar27->addr[uVar45] = (uint)puVar1;
      pHVar27->head[uVar45] = uVar36;
      pBVar43 = s;
    }
  }
  else if (iVar18 == 0x2a) {
    InitH42((MemoryManager *)(s->hashers_).h42,pHVar5,(uint8_t *)s,pBVar44,uVar47,sVar48,iVar19);
    pBVar43 = s;
    if ((2 < uVar47) && (2 < uVar45)) {
      pHVar16 = (s->hashers_).h42;
      puVar1 = &pBVar44[-1].field_0x1d;
      uVar45 = (uint)(*(int *)((long)pHVar5->addr + (ulong)((uint)puVar1 & uVar4)) * 0x1e35a7bd) >>
               0x11;
      uVar29 = uVar45 & 0x1ff;
      uVar37 = pHVar16->free_slot_idx[uVar29];
      pHVar16->free_slot_idx[uVar29] = uVar37 + 1;
      uVar22 = (ulong)uVar37 & 0x1ff;
      uVar32 = (long)puVar1 - (ulong)pHVar16->addr[uVar45];
      pHVar16->tiny_hash[(ulong)puVar1 & 0xffff] = (uint8_t)uVar45;
      if (0xfffe < uVar32) {
        uVar32 = 0xffff;
      }
      *(short *)((long)&pHVar16->banks[0].slots[uVar22].delta + (ulong)(uVar29 << 0xb)) =
           (short)uVar32;
      *(uint16_t *)((long)&pHVar16->banks[0].slots[uVar22].next + (ulong)(uVar29 << 0xb)) =
           pHVar16->head[uVar45];
      pHVar16->addr[uVar45] = (uint)puVar1;
      pHVar16->head[uVar45] = (uint16_t)uVar22;
      puVar1 = &pBVar44[-1].field_0x1e;
      uVar45 = (uint)(*(int *)((long)pHVar5->addr + (ulong)((uint)puVar1 & uVar4)) * 0x1e35a7bd) >>
               0x11;
      uVar29 = uVar45 & 0x1ff;
      uVar37 = pHVar16->free_slot_idx[uVar29];
      pHVar16->free_slot_idx[uVar29] = uVar37 + 1;
      uVar32 = (ulong)uVar37 & 0x1ff;
      uVar22 = (long)puVar1 - (ulong)pHVar16->addr[uVar45];
      pHVar16->tiny_hash[(ulong)puVar1 & 0xffff] = (uint8_t)uVar45;
      if (0xfffe < uVar22) {
        uVar22 = 0xffff;
      }
      *(short *)((long)&pHVar16->banks[0].slots[uVar32].delta + (ulong)(uVar29 << 0xb)) =
           (short)uVar22;
      *(uint16_t *)((long)&pHVar16->banks[0].slots[uVar32].next + (ulong)(uVar29 << 0xb)) =
           pHVar16->head[uVar45];
      pHVar16->addr[uVar45] = (uint)puVar1;
      pHVar16->head[uVar45] = (uint16_t)uVar32;
      puVar1 = &pBVar44[-1].field_0x1f;
      uVar29 = (uint)(*(int *)((long)pHVar5->addr + (ulong)((uint)puVar1 & uVar4)) * 0x1e35a7bd) >>
               0x11;
      uVar45 = uVar29 & 0x1ff;
      uVar37 = pHVar16->free_slot_idx[uVar45];
      pHVar16->free_slot_idx[uVar45] = uVar37 + 1;
      uVar22 = (ulong)uVar37 & 0x1ff;
      uVar32 = (long)puVar1 - (ulong)pHVar16->addr[uVar29];
      pHVar16->tiny_hash[(ulong)puVar1 & 0xffff] = (uint8_t)uVar29;
      if (0xfffe < uVar32) {
        uVar32 = 0xffff;
      }
      *(short *)((long)&pHVar16->banks[0].slots[uVar22].delta + (ulong)(uVar45 << 0xb)) =
           (short)uVar32;
      *(uint16_t *)((long)&pHVar16->banks[0].slots[uVar22].next + (ulong)(uVar45 << 0xb)) =
           pHVar16->head[uVar29];
      pHVar16->addr[uVar29] = (uint)puVar1;
      pHVar16->head[uVar29] = (uint16_t)uVar22;
    }
  }
  else if (iVar18 == 0x36) {
    pHVar24 = (s->hashers_).h54;
    if (((is_last == 0) || (0x8000 < uVar29)) || (uVar45 != 0)) {
      if (pHVar24->is_dirty_ != 0) {
        memset(pHVar24,0,0x400014);
      }
    }
    else if (uVar47 != 0) {
      uVar22 = 0;
      do {
        puVar20 = pHVar24->buckets_ +
                  ((ulong)(*(long *)((long)pHVar5->addr + uVar22) * 0x35a7bd1e35a7bd00) >> 0x2c);
        puVar20[0] = 0;
        puVar20[1] = 0;
        puVar20[2] = 0;
        puVar20[3] = 0;
        uVar22 = uVar22 + 1;
      } while (uVar47 != uVar22);
      pHVar24->is_dirty_ = 0;
    }
    pBVar43 = s;
    if ((6 < uVar29) && (2 < uVar45)) {
      pHVar24 = (s->hashers_).h54;
      uVar29 = uVar45 - 3;
      pHVar24->buckets_
      [(uint)((ulong)(*(long *)((long)pHVar5->addr + (ulong)(uVar29 & uVar4)) * 0x35a7bd1e35a7bd00)
             >> 0x2c) + (uVar29 >> 3 & 3)] = uVar29;
      uVar29 = uVar45 - 2;
      pHVar24->buckets_
      [(uint)((ulong)(*(long *)((long)pHVar5->addr + (ulong)(uVar29 & uVar4)) * 0x35a7bd1e35a7bd00)
             >> 0x2c) + (uVar29 >> 3 & 3)] = uVar29;
      uVar29 = (uint)((ulong)(*(long *)((long)pHVar5->addr + (ulong)(uVar45 - 1 & uVar4)) *
                             0x35a7bd1e35a7bd00) >> 0x2c);
      goto LAB_0012f096;
    }
  }
switchD_0012e11d_default:
  psVar46 = &s->num_commands_;
  iVar19 = (s->params).quality;
  if (iVar19 == 0xb) {
    BrotliCreateHqZopfliBackwardReferences
              (m,uVar47,(size_t)pBVar44,(uint8_t *)pHVar5,ringbuffer_mask,&s->params,
               (s->hashers_).h10,s->dist_cache_,&s->last_insert_len_,s->commands_ + s->num_commands_
               ,psVar46,&s->num_literals_);
  }
  else if (iVar19 == 10) {
    BrotliCreateZopfliBackwardReferences
              (m,uVar47,(size_t)pBVar44,(uint8_t *)pHVar5,ringbuffer_mask,&s->params,
               (s->hashers_).h10,s->dist_cache_,&s->last_insert_len_,s->commands_ + s->num_commands_
               ,psVar46,&s->num_literals_);
  }
  else {
    BrotliCreateBackwardReferences
              (uVar47,(size_t)pBVar44,(uint8_t *)pHVar5,ringbuffer_mask,&s->params,local_150,
               s->dist_cache_,&s->last_insert_len_,s->commands_ + s->num_commands_,psVar46,
               &s->num_literals_);
  }
  iVar19 = (s->params).lgwin;
  iVar18 = (s->params).lgblock;
  if (iVar18 < iVar19) {
    iVar18 = iVar19;
  }
  cVar28 = '\x17';
  if (iVar18 < 0x17) {
    cVar28 = (char)iVar18;
  }
  uVar22 = 1L << (cVar28 + 1U & 0x3f);
  uVar14 = s->input_pos_;
  uVar15 = s->last_flush_pos_;
  EnsureInitialized(s);
  if ((s->params).quality < 4) {
    bVar52 = 0x2ffe < s->num_commands_ + s->num_literals_;
  }
  else {
    bVar52 = false;
  }
  if (((((int)local_160 != 0 || is_last != 0) || (bVar52)) ||
      (uVar22 < (uVar14 - uVar15) + (1L << ((byte)(s->params).lgblock & 0x3f)))) ||
     ((uVar22 = uVar22 >> 3, uVar22 <= s->num_literals_ || (uVar22 <= *psVar46)))) {
    uVar22 = s->last_insert_len_;
    if (uVar22 != 0) {
      pCVar23 = s->commands_;
      sVar48 = s->num_commands_;
      s->num_commands_ = sVar48 + 1;
      pCVar23[sVar48].insert_len_ = (uint32_t)uVar22;
      pCVar23[sVar48].copy_len_ = 0x4000000;
      pCVar23[sVar48].dist_extra_ = 0;
      pCVar23[sVar48].dist_prefix_ = 0x10;
      if (uVar22 < 6) {
        uVar32 = uVar22 & 0xffffffff;
      }
      else if (uVar22 < 0x82) {
        uVar45 = 0x1f;
        uVar29 = (uint)(uVar22 - 2);
        if (uVar29 != 0) {
          for (; uVar29 >> uVar45 == 0; uVar45 = uVar45 - 1) {
          }
        }
        uVar32 = (ulong)((int)(uVar22 - 2 >> ((char)(uVar45 ^ 0xffffffe0) + 0x1fU & 0x3f)) +
                         (uVar45 ^ 0xffffffe0) * 2 + 0x40);
      }
      else if (uVar22 < 0x842) {
        uVar29 = (uint32_t)uVar22 - 0x42;
        uVar45 = 0x1f;
        if (uVar29 != 0) {
          for (; uVar29 >> uVar45 == 0; uVar45 = uVar45 - 1) {
          }
        }
        uVar32 = (ulong)((uVar45 ^ 0xffe0) + 0x2a);
      }
      else {
        uVar32 = 0x15;
        if (0x1841 < uVar22) {
          uVar32 = (ulong)(ushort)(0x17 - (uVar22 < 0x5842));
        }
      }
      pCVar23[sVar48].cmd_prefix_ =
           (short)uVar32 * 8 & 0x38U |
           *(ushort *)
            (CombineLengthCodes_cells + (ulong)(uint)((int)((uVar32 & 0xffff) >> 3) * 3) * 2) | 2;
      s->num_literals_ = s->num_literals_ + uVar22;
      s->last_insert_len_ = 0;
    }
    if ((is_last != 0) || (s->input_pos_ != s->last_flush_pos_)) {
      uVar22 = s->input_pos_;
      uVar32 = s->last_flush_pos_;
      local_188 = out_size;
      if (uVar22 < uVar32) {
        __assert_fail("s->input_pos_ >= s->last_flush_pos_",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/brezza92[P]brotli/enc/encode.c"
                      ,0x3bf,
                      "int EncodeData(BrotliEncoderState *, const int, const int, size_t *, uint8_t **)"
                     );
      }
      uVar47 = uVar22 - uVar32;
      if ((uVar22 < uVar32 || uVar47 == 0) && is_last == 0) {
        __assert_fail("s->input_pos_ > s->last_flush_pos_ || is_last",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/brezza92[P]brotli/enc/encode.c"
                      ,0x3c0,
                      "int EncodeData(BrotliEncoderState *, const int, const int, size_t *, uint8_t **)"
                     );
      }
      local_138 = psVar46;
      if (0x1000000 < uVar47) {
        __assert_fail("s->input_pos_ - s->last_flush_pos_ <= 1u << 24",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/brezza92[P]brotli/enc/encode.c"
                      ,0x3c1,
                      "int EncodeData(BrotliEncoderState *, const int, const int, size_t *, uint8_t **)"
                     );
      }
      puVar21 = GetBrotliStorage(s,uVar47 * 2 + 0x1f6);
      bVar2 = pBVar43->last_byte_bits_;
      storage_ix_1 = (size_t)bVar2;
      *puVar21 = pBVar43->last_byte_;
      uVar51 = pBVar43->last_flush_pos_;
      uVar45 = (uint)uVar51;
      if (0xbfffffff < uVar51) {
        uVar45 = ((int)(uVar45 * 2) >> 1 & 0xc0000000U) + (uVar45 & 0x3fffffff) + 0x80000000;
      }
      local_178 = pBVar43->saved_dist_cache_;
      local_160 = pBVar43->dist_cache_;
      pBVar50 = pBVar43;
      if (uVar22 == uVar32) {
        *(ulong *)(puVar21 + (bVar2 >> 3)) = 3L << (bVar2 & 7) | (ulong)puVar21[bVar2 >> 3];
        storage_ix_1 = (size_t)(bVar2 + 9 & 0xfffffff8);
        psVar46 = local_188;
      }
      else {
        local_168 = CONCAT44(local_168._4_4_,uVar45);
        local_198 = CONCAT71(local_198._1_7_,pBVar43->prev_byte_);
        local_180 = CONCAT71(local_180._1_7_,pBVar43->prev_byte2_);
        local_190 = pBVar43->commands_;
        local_170 = (Command *)pBVar43->num_commands_;
        iVar19 = ShouldCompress((uint8_t *)pHVar5,ringbuffer_mask,uVar51,uVar47,
                                pBVar43->num_literals_,(size_t)local_170);
        pCVar23 = local_170;
        if (iVar19 == 0) {
          uVar17 = *(undefined8 *)(local_178 + 2);
          *(undefined8 *)local_160 = *(undefined8 *)local_178;
          *(undefined8 *)(local_160 + 2) = uVar17;
          BrotliStoreUncompressedMetaBlock
                    (is_last,(uint8_t *)pHVar5,local_168 & 0xffffffff,ringbuffer_mask,uVar47,
                     &storage_ix_1,puVar21);
          psVar46 = local_188;
        }
        else {
          uVar3 = *puVar21;
          uVar22 = storage_ix_1 & 0xff;
          pBVar44 = (BrotliEncoderParams *)0x0;
          if ((pBVar43->params).quality < 10) {
            uVar32 = 0;
          }
          else {
            uVar32 = 0;
            if ((pBVar43->params).mode == BROTLI_MODE_FONT) {
              uVar32 = 1;
              pBVar44 = (BrotliEncoderParams *)0xc;
              if (local_170 != (Command *)0x0) {
                puVar26 = &local_190->dist_prefix_;
                pCVar34 = local_170;
                do {
                  if (((*(uint *)(puVar26 + -5) & 0xffffff) != 0) && (0x7f < puVar26[-1])) {
                    uVar37 = *puVar26;
                    uVar45 = (uint)uVar37;
                    if (0xf < uVar37) {
                      uVar45 = *(uint *)(puVar26 + -3);
                      uVar45 = ((uint)uVar37 + (uVar45 >> 0x18) * -2 + -0xc <<
                               ((byte)(uVar45 >> 0x18) & 0x1f)) + (uVar45 & 0xffffff) + 0xc;
                    }
                    if (uVar45 < 0x1c) {
                      *puVar26 = (ushort)uVar45;
                      uVar45 = 0;
                    }
                    else {
                      uVar32 = (ulong)uVar45 - 0x14;
                      uVar29 = 0x1f;
                      if ((uint)uVar32 != 0) {
                        for (; (uint)uVar32 >> uVar29 == 0; uVar29 = uVar29 - 1) {
                        }
                      }
                      uVar30 = (uVar29 ^ 0xffffffe0) + 0x1f;
                      bVar52 = (uVar32 >> ((ulong)uVar30 & 0x3f) & 1) != 0;
                      *puVar26 = ((ushort)uVar45 & 1) +
                                 (ushort)bVar52 * 2 + (short)(uVar29 ^ 0xffffffe0) * 4 + 0x90;
                      uVar45 = (uint)(uVar32 - ((ulong)bVar52 + 2 << ((byte)uVar30 & 0x3f)) >> 1) |
                               uVar30 * 0x1000000 - 0x1000000;
                    }
                    *(uint *)(puVar26 + -3) = uVar45;
                  }
                  puVar26 = puVar26 + 8;
                  pCVar34 = (Command *)((long)&pCVar34[-1].dist_prefix_ + 1);
                } while (pCVar34 != (Command *)0x0);
                uVar32 = 1;
              }
            }
          }
          iVar19 = (pBVar43->params).quality;
          if (iVar19 < 3) {
            BrotliStoreMetaBlockFast
                      (m,(uint8_t *)pHVar5,local_168 & 0xffffffff,uVar47,ringbuffer_mask,is_last,
                       local_190,(size_t)local_170,&storage_ix_1,puVar21);
            psVar46 = local_188;
            pBVar43 = pBVar50;
          }
          else {
            local_140 = pBVar44;
            if (iVar19 == 3) {
              BrotliStoreMetaBlockTrivial
                        (m,(uint8_t *)pHVar5,local_168 & 0xffffffff,uVar47,ringbuffer_mask,is_last,
                         local_190,(size_t)local_170,&storage_ix_1,puVar21);
              psVar46 = local_188;
              pBVar43 = pBVar50;
            }
            else {
              literal_context_mode = CONTEXT_UTF8;
              local_158 = local_168 & 0xffffffff;
              local_130 = uVar32;
              BrotliInitBlockSplit((BlockSplit *)&storage_ix);
              BrotliInitBlockSplit(&local_e0);
              BrotliInitBlockSplit(&local_b0);
              uVar32 = local_158;
              local_40 = (HistogramDistance *)0x0;
              sStack_38 = 0;
              local_50 = (HistogramCommand *)0x0;
              sStack_48 = 0;
              local_60 = (HistogramLiteral *)0x0;
              sStack_58 = 0;
              local_70 = (uint32_t *)0x0;
              sStack_68 = 0;
              local_80 = (uint32_t *)0x0;
              sStack_78 = 0;
              iVar19 = (pBVar50->params).quality;
              local_180 = local_180 & 0xff;
              local_198 = CONCAT44(local_198._4_4_,(uint)(byte)local_198);
              local_118 = uVar22;
              if (iVar19 < 10) {
                table_size = 1;
                local_120 = (uint32_t *)0x0;
                if ((pBVar50->params).disable_literal_context_modeling == 0) {
                  DecideOverLiteralContextModeling
                            ((uint8_t *)pHVar5,local_158,uVar47,ringbuffer_mask,iVar19,
                             &literal_context_mode,&table_size,&local_120);
                }
                BrotliBuildMetaBlockGreedy
                          (m,(uint8_t *)pHVar5,uVar32,ringbuffer_mask,(uint8_t)local_198,
                           (uint8_t)local_180,literal_context_mode,table_size,local_120,local_190,
                           (size_t)pCVar23,(MetaBlockSplit *)&storage_ix);
                pBVar43 = pBVar50;
              }
              else {
                iVar19 = BrotliIsMostlyUTF8((uint8_t *)pHVar5,local_158,ringbuffer_mask,uVar47,0.75)
                ;
                if (iVar19 == 0) {
                  literal_context_mode = CONTEXT_SIGNED;
                }
                pBVar43 = pBVar50;
                BrotliBuildMetaBlock
                          (m,(uint8_t *)pHVar5,uVar32,ringbuffer_mask,&pBVar50->params,
                           (uint8_t)local_198,(uint8_t)local_180,local_190,(size_t)pCVar23,
                           literal_context_mode,(MetaBlockSplit *)&storage_ix);
              }
              psVar46 = local_188;
              if (3 < (pBVar50->params).quality) {
                BrotliOptimizeHistograms
                          ((ulong)local_140 & 0xffffffff,local_130 & 0xffffffff,
                           (MetaBlockSplit *)&storage_ix);
              }
              BrotliStoreMetaBlock
                        (m,(uint8_t *)pHVar5,local_158,uVar47,ringbuffer_mask,(uint8_t)local_198,
                         (uint8_t)local_180,is_last,(uint32_t)local_140,(uint32_t)local_130,
                         literal_context_mode,local_190,(size_t)local_170,
                         (MetaBlockSplit *)&storage_ix,&storage_ix_1,puVar21);
              BrotliDestroyBlockSplit(m,(BlockSplit *)&storage_ix);
              BrotliDestroyBlockSplit(m,&local_e0);
              BrotliDestroyBlockSplit(m,&local_b0);
              BrotliFree(m,local_80);
              local_80 = (uint32_t *)0x0;
              BrotliFree(m,local_70);
              local_70 = (uint32_t *)0x0;
              BrotliFree(m,local_60);
              local_60 = (HistogramLiteral *)0x0;
              BrotliFree(m,local_50);
              local_50 = (HistogramCommand *)0x0;
              BrotliFree(m,local_40);
              uVar22 = local_118;
            }
          }
          pBVar50 = pBVar43;
          if (uVar47 + 4 < storage_ix_1 >> 3) {
            uVar17 = *(undefined8 *)(local_178 + 2);
            *(undefined8 *)local_160 = *(undefined8 *)local_178;
            *(undefined8 *)(local_160 + 2) = uVar17;
            *puVar21 = uVar3;
            storage_ix_1 = uVar22;
            BrotliStoreUncompressedMetaBlock
                      (is_last,(uint8_t *)pHVar5,local_168 & 0xffffffff,ringbuffer_mask,uVar47,
                       &storage_ix_1,puVar21);
            pBVar50 = pBVar43;
          }
        }
      }
      uVar22 = storage_ix_1 >> 3;
      pBVar43->last_byte_ = puVar21[uVar22];
      pBVar43->last_byte_bits_ = (byte)storage_ix_1 & 7;
      pBVar43->last_flush_pos_ = pBVar43->input_pos_;
      iVar19 = UpdateLastProcessedPos(pBVar43);
      if (iVar19 != 0) {
        iVar19 = (pBVar50->params).quality;
        iVar18 = 10;
        if (((iVar19 < 10) &&
            (((iVar19 != 4 || (iVar18 = 0x36, (pBVar50->params).size_hint < 0x100000)) &&
             (iVar18 = iVar19, 4 < iVar19)))) && ((pBVar50->params).lgwin < 0x11)) {
          iVar18 = 0x28;
          if (6 < iVar19) {
            iVar18 = (iVar19 == 9) + 0x29;
          }
        }
        if (iVar18 < 0x28) {
          switch(iVar18) {
          case 2:
            pHVar6 = local_150->h2;
            pHVar6->is_dirty_ = 1;
            (pHVar6->dict_search_stats_).num_lookups = 0;
            (pHVar6->dict_search_stats_).num_matches = 0;
            break;
          case 3:
            pHVar11 = (pBVar50->hashers_).h3;
            pHVar11->is_dirty_ = 1;
            (pHVar11->dict_search_stats_).num_lookups = 0;
            (pHVar11->dict_search_stats_).num_matches = 0;
            break;
          case 4:
            pHVar8 = (pBVar50->hashers_).h4;
            pHVar8->is_dirty_ = 1;
            (pHVar8->dict_search_stats_).num_lookups = 0;
            (pHVar8->dict_search_stats_).num_matches = 0;
            break;
          case 5:
            pHVar9 = (pBVar50->hashers_).h5;
            pHVar9->is_dirty_ = 1;
            (pHVar9->dict_search_stats_).num_lookups = 0;
            (pHVar9->dict_search_stats_).num_matches = 0;
            break;
          case 6:
            pHVar7 = (pBVar50->hashers_).h6;
            pHVar7->is_dirty_ = 1;
            (pHVar7->dict_search_stats_).num_lookups = 0;
            (pHVar7->dict_search_stats_).num_matches = 0;
            break;
          case 7:
            pHVar12 = (pBVar50->hashers_).h7;
            pHVar12->is_dirty_ = 1;
            (pHVar12->dict_search_stats_).num_lookups = 0;
            (pHVar12->dict_search_stats_).num_matches = 0;
            break;
          case 8:
            pHVar25 = (pBVar50->hashers_).h8;
            pHVar25->is_dirty_ = 1;
            (pHVar25->dict_search_stats_).num_lookups = 0;
            (pHVar25->dict_search_stats_).num_matches = 0;
            break;
          case 9:
            pHVar10 = (pBVar50->hashers_).h9;
            pHVar10->is_dirty_ = 1;
            (pHVar10->dict_search_stats_).num_lookups = 0;
            (pHVar10->dict_search_stats_).num_matches = 0;
            break;
          case 10:
            ((pBVar50->hashers_).h10)->is_dirty_ = 1;
          }
        }
        else if (iVar18 < 0x2a) {
          if (iVar18 == 0x28) {
            pHVar27 = (H41 *)(pBVar50->hashers_).h40;
          }
          else {
            if (iVar18 != 0x29) goto switchD_0012fcbc_default;
            pHVar27 = (pBVar50->hashers_).h41;
          }
          pHVar27->is_dirty_ = 1;
          (pHVar27->dict_search_stats_).num_lookups = 0;
          (pHVar27->dict_search_stats_).num_matches = 0;
        }
        else if (iVar18 == 0x2a) {
          pHVar16 = (pBVar50->hashers_).h42;
          pHVar16->is_dirty_ = 1;
          (pHVar16->dict_search_stats_).num_lookups = 0;
          (pHVar16->dict_search_stats_).num_matches = 0;
        }
        else if (iVar18 == 0x36) {
          pHVar24 = (pBVar50->hashers_).h54;
          pHVar24->is_dirty_ = 1;
          (pHVar24->dict_search_stats_).num_lookups = 0;
          (pHVar24->dict_search_stats_).num_matches = 0;
        }
      }
switchD_0012fcbc_default:
      uVar32 = pBVar50->last_flush_pos_;
      if (uVar32 != 0) {
        pBVar50->prev_byte_ = *(uint8_t *)((long)pHVar5->addr + (ulong)(uVar4 & (int)uVar32 - 1U));
      }
      if (1 < uVar32) {
        pBVar50->prev_byte2_ = *(uint8_t *)((long)pHVar5->addr + (ulong)(uVar4 & (int)uVar32 - 2U));
      }
      *local_138 = 0;
      local_138[1] = 0;
      uVar17 = *(undefined8 *)(local_160 + 2);
      *(undefined8 *)local_178 = *(undefined8 *)local_160;
      *(undefined8 *)(local_178 + 2) = uVar17;
      *local_128 = puVar21;
      *psVar46 = uVar22;
      return 1;
    }
  }
  else {
    iVar19 = UpdateLastProcessedPos(s);
    if (iVar19 != 0) {
      iVar19 = (pBVar43->params).quality;
      iVar18 = 10;
      if (((iVar19 < 10) &&
          ((iVar19 != 4 || (iVar18 = 0x36, (pBVar43->params).size_hint < 0x100000)))) &&
         ((iVar18 = iVar19, 4 < iVar19 && ((pBVar43->params).lgwin < 0x11)))) {
        iVar18 = 0x28;
        if (6 < iVar19) {
          iVar18 = (iVar19 == 9) + 0x29;
        }
      }
      if (iVar18 < 0x28) {
        switch(iVar18) {
        case 2:
          pHVar6 = local_150->h2;
          pHVar6->is_dirty_ = 1;
          (pHVar6->dict_search_stats_).num_lookups = 0;
          (pHVar6->dict_search_stats_).num_matches = 0;
          break;
        case 3:
          pHVar11 = (pBVar43->hashers_).h3;
          pHVar11->is_dirty_ = 1;
          (pHVar11->dict_search_stats_).num_lookups = 0;
          (pHVar11->dict_search_stats_).num_matches = 0;
          break;
        case 4:
          pHVar8 = (pBVar43->hashers_).h4;
          pHVar8->is_dirty_ = 1;
          (pHVar8->dict_search_stats_).num_lookups = 0;
          (pHVar8->dict_search_stats_).num_matches = 0;
          break;
        case 5:
          pHVar9 = (pBVar43->hashers_).h5;
          pHVar9->is_dirty_ = 1;
          (pHVar9->dict_search_stats_).num_lookups = 0;
          (pHVar9->dict_search_stats_).num_matches = 0;
          break;
        case 6:
          pHVar7 = (pBVar43->hashers_).h6;
          pHVar7->is_dirty_ = 1;
          (pHVar7->dict_search_stats_).num_lookups = 0;
          (pHVar7->dict_search_stats_).num_matches = 0;
          break;
        case 7:
          pHVar12 = (pBVar43->hashers_).h7;
          pHVar12->is_dirty_ = 1;
          (pHVar12->dict_search_stats_).num_lookups = 0;
          (pHVar12->dict_search_stats_).num_matches = 0;
          break;
        case 8:
          pHVar25 = (pBVar43->hashers_).h8;
          pHVar25->is_dirty_ = 1;
          (pHVar25->dict_search_stats_).num_lookups = 0;
          (pHVar25->dict_search_stats_).num_matches = 0;
          break;
        case 9:
          pHVar10 = (pBVar43->hashers_).h9;
          pHVar10->is_dirty_ = 1;
          (pHVar10->dict_search_stats_).num_lookups = 0;
          (pHVar10->dict_search_stats_).num_matches = 0;
          break;
        case 10:
          ((pBVar43->hashers_).h10)->is_dirty_ = 1;
        }
      }
      else if (iVar18 < 0x2a) {
        if (iVar18 == 0x28) {
          pHVar27 = (H41 *)(pBVar43->hashers_).h40;
        }
        else {
          if (iVar18 != 0x29) goto switchD_0012fed4_default;
          pHVar27 = (pBVar43->hashers_).h41;
        }
        pHVar27->is_dirty_ = 1;
        (pHVar27->dict_search_stats_).num_lookups = 0;
        (pHVar27->dict_search_stats_).num_matches = 0;
      }
      else if (iVar18 == 0x2a) {
        pHVar5 = (pBVar43->hashers_).h42;
        pHVar5->is_dirty_ = 1;
        (pHVar5->dict_search_stats_).num_lookups = 0;
        (pHVar5->dict_search_stats_).num_matches = 0;
      }
      else if (iVar18 == 0x36) {
        pHVar24 = (pBVar43->hashers_).h54;
        pHVar24->is_dirty_ = 1;
        (pHVar24->dict_search_stats_).num_lookups = 0;
        (pHVar24->dict_search_stats_).num_matches = 0;
      }
    }
  }
switchD_0012fed4_default:
  *out_size = 0;
  return 1;
code_r0x0012ea14:
  uVar47 = uVar47 + 1;
  lVar40 = lVar40 + -8;
  if (uVar22 >> 3 == uVar47) goto code_r0x0012ea20;
  goto LAB_0012ea07;
code_r0x0012ea20:
  pcVar33 = pcVar33 + -lVar40;
LAB_0012eb0c:
  uVar22 = uVar22 & 7;
  uVar47 = uVar51;
  if (uVar22 != 0) {
    uVar41 = uVar51 | uVar22;
    do {
      uVar47 = uVar51;
      if (*(char *)((long)local_178 + (long)pCVar23 + uVar51) != *pcVar33) break;
      pcVar33 = pcVar33 + 1;
      uVar51 = uVar51 + 1;
      uVar22 = uVar22 - 1;
      uVar47 = uVar41;
    } while (uVar22 != 0);
  }
LAB_0012ea39:
  pCVar23 = (Command *)((long)&pCVar23->insert_len_ + uVar47);
  s = pBVar43;
  local_168 = uVar32;
  local_138 = psVar46;
  iVar19 = bcmp(local_178,__s2,(size_t)pCVar23);
  if (iVar19 != 0) {
    __assert_fail("0 == memcmp(&data[cur_ix_masked], &data[prev_ix_masked], len)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/brezza92[P]brotli/enc/./././hash_to_binary_tree_inc.h"
                  ,0xa2,
                  "BackwardMatch *StoreAndFindMatchesH10(H10 *, const uint8_t *const restrict, const size_t, const size_t, const size_t, const size_t, size_t *const restrict, BackwardMatch *restrict)"
                 );
  }
  uVar32 = local_168;
  uVar22 = local_180;
  pBVar43 = s;
  if (pCVar23 < (Command *)0x80) {
    uVar47 = (ulong)pBVar35 & local_198;
    psVar46 = (size_t *)(uVar47 * 2);
    if (*(byte *)((long)__s2 + (long)pCVar23) < *(byte *)((long)local_178 + (long)pCVar23)) {
      puVar20 = pHVar13->forest_;
      puVar20[local_168] = uVar45;
      puVar31 = puVar20 + uVar47 * 2 + 1;
      uVar32 = (ulong)psVar46 | 1;
      psVar46 = local_138;
      local_190 = pCVar23;
    }
    else {
      puVar20 = pHVar13->forest_;
      puVar20[(long)local_138] = uVar45;
      puVar31 = puVar20 + uVar47 * 2;
      local_170 = pCVar23;
    }
    pBVar35 = (BrotliEncoderParams *)(ulong)*puVar31;
    bVar52 = true;
  }
  else {
    puVar20 = pHVar13->forest_;
    puVar20[local_168] = puVar20[((ulong)pBVar35 & local_198) * 2];
    puVar20[(long)local_138] = puVar20[((ulong)pBVar35 & local_198) * 2 + 1];
    bVar52 = false;
    psVar46 = local_138;
  }
LAB_0012eafc:
  lVar49 = lVar49 + -1;
  if (!bVar52) goto LAB_0012eb3f;
  goto LAB_0012e95c;
LAB_0012eb3f:
  pBVar42 = (BrotliEncoderParams *)((long)&pBVar42->mode + 1);
  out_size = local_188;
  uVar47 = local_158;
  if (pBVar42 == local_140) goto switchD_0012e11d_default;
  goto LAB_0012e8e9;
}

Assistant:

static BROTLI_BOOL EncodeData(
    BrotliEncoderState* s, const BROTLI_BOOL is_last,
    const BROTLI_BOOL force_flush, size_t* out_size, uint8_t** output) {
  const uint64_t delta = UnprocessedInputSize(s);
  const uint32_t bytes = (uint32_t)delta;
  const uint32_t wrapped_last_processed_pos =
      WrapPosition(s->last_processed_pos_);
  uint8_t* data;
  uint32_t mask;
  MemoryManager* m = &s->memory_manager_;

  if (!EnsureInitialized(s)) return BROTLI_FALSE;
  data = s->ringbuffer_.buffer_;
  mask = s->ringbuffer_.mask_;

  /* Adding more blocks after "last" block is forbidden. */
  if (s->is_last_block_emitted_) return BROTLI_FALSE;
  if (is_last) s->is_last_block_emitted_ = BROTLI_TRUE;

  if (delta > InputBlockSize(s)) {
    return BROTLI_FALSE;
  }
  if (s->params.quality == FAST_TWO_PASS_COMPRESSION_QUALITY &&
      !s->command_buf_) {
    s->command_buf_ =
        BROTLI_ALLOC(m, uint32_t, kCompressFragmentTwoPassBlockSize);
    s->literal_buf_ =
        BROTLI_ALLOC(m, uint8_t, kCompressFragmentTwoPassBlockSize);
    if (BROTLI_IS_OOM(m)) return BROTLI_FALSE;
  }

  if (s->params.quality == FAST_ONE_PASS_COMPRESSION_QUALITY ||
      s->params.quality == FAST_TWO_PASS_COMPRESSION_QUALITY) {
    uint8_t* storage;
    size_t storage_ix = s->last_byte_bits_;
    size_t table_size;
    int* table;

    if (delta == 0 && !is_last) {
      /* We have no new input data and we don't have to finish the stream, so
         nothing to do. */
      *out_size = 0;
      return BROTLI_TRUE;
    }
    storage = GetBrotliStorage(s, 2 * bytes + 502);
    if (BROTLI_IS_OOM(m)) return BROTLI_FALSE;
    storage[0] = s->last_byte_;
    table = GetHashTable(s, s->params.quality, bytes, &table_size);
    if (BROTLI_IS_OOM(m)) return BROTLI_FALSE;
    if (s->params.quality == FAST_ONE_PASS_COMPRESSION_QUALITY) {
      BrotliCompressFragmentFast(
          m, &data[wrapped_last_processed_pos & mask],
          bytes, is_last,
          table, table_size,
          s->cmd_depths_, s->cmd_bits_,
          &s->cmd_code_numbits_, s->cmd_code_,
          &storage_ix, storage);
      if (BROTLI_IS_OOM(m)) return BROTLI_FALSE;
    } else {
      BrotliCompressFragmentTwoPass(
          m, &data[wrapped_last_processed_pos & mask],
          bytes, is_last,
          s->command_buf_, s->literal_buf_,
          table, table_size,
          &storage_ix, storage);
      if (BROTLI_IS_OOM(m)) return BROTLI_FALSE;
    }
    s->last_byte_ = storage[storage_ix >> 3];
    s->last_byte_bits_ = storage_ix & 7u;
    UpdateLastProcessedPos(s);
    *output = &storage[0];
    *out_size = storage_ix >> 3;
    return BROTLI_TRUE;
  }

  {
    /* Theoretical max number of commands is 1 per 2 bytes. */
    size_t newsize = s->num_commands_ + bytes / 2 + 1;
    if (newsize > s->cmd_alloc_size_) {
      Command* new_commands;
      /* Reserve a bit more memory to allow merging with a next block
         without reallocation: that would impact speed. */
      newsize += (bytes / 4) + 16;
      s->cmd_alloc_size_ = newsize;
      new_commands = BROTLI_ALLOC(m, Command, newsize);
      if (BROTLI_IS_OOM(m)) return BROTLI_FALSE;
      if (s->commands_) {
        memcpy(new_commands, s->commands_, sizeof(Command) * s->num_commands_);
        BROTLI_FREE(m, s->commands_);
      }
      s->commands_ = new_commands;
    }
  }

  InitOrStitchToPreviousBlock(m, &s->hashers_, data, mask, &s->params,
      wrapped_last_processed_pos, bytes, is_last);
  if (BROTLI_IS_OOM(m)) return BROTLI_FALSE;

  if (s->params.quality == ZOPFLIFICATION_QUALITY) {
    BrotliCreateZopfliBackwardReferences(
        m, bytes, wrapped_last_processed_pos, data, mask,
        &s->params, s->hashers_.h10, s->dist_cache_, &s->last_insert_len_,
        &s->commands_[s->num_commands_], &s->num_commands_, &s->num_literals_);
    if (BROTLI_IS_OOM(m)) return BROTLI_FALSE;
  } else if (s->params.quality == HQ_ZOPFLIFICATION_QUALITY) {
    BrotliCreateHqZopfliBackwardReferences(
        m, bytes, wrapped_last_processed_pos, data, mask,
        &s->params, s->hashers_.h10, s->dist_cache_, &s->last_insert_len_,
        &s->commands_[s->num_commands_], &s->num_commands_, &s->num_literals_);
    if (BROTLI_IS_OOM(m)) return BROTLI_FALSE;
  } else {
    BrotliCreateBackwardReferences(
        bytes, wrapped_last_processed_pos, data, mask,
        &s->params, &s->hashers_, s->dist_cache_, &s->last_insert_len_,
        &s->commands_[s->num_commands_], &s->num_commands_, &s->num_literals_);
  }

  {
    const size_t max_length = MaxMetablockSize(&s->params);
    const size_t max_literals = max_length / 8;
    const size_t max_commands = max_length / 8;
    const size_t processed_bytes = (size_t)(s->input_pos_ - s->last_flush_pos_);
    /* If maximal possible additional block doesn't fit metablock, flush now. */
    /* TODO: Postpone decision until next block arrives? */
    const BROTLI_BOOL next_input_fits_metablock = TO_BROTLI_BOOL(
        processed_bytes + InputBlockSize(s) <= max_length);
    /* If block splitting is not used, then flush as soon as there is some
       amount of commands / literals produced. */
    const BROTLI_BOOL should_flush = TO_BROTLI_BOOL(
        s->params.quality < MIN_QUALITY_FOR_BLOCK_SPLIT &&
        s->num_literals_ + s->num_commands_ >= MAX_NUM_DELAYED_SYMBOLS);
    if (!is_last && !force_flush && !should_flush &&
        next_input_fits_metablock &&
        s->num_literals_ < max_literals &&
        s->num_commands_ < max_commands) {
      /* Merge with next input block. Everything will happen later. */
      if (UpdateLastProcessedPos(s)) {
        HashersReset(&s->hashers_, ChooseHasher(&s->params));
      }
      *out_size = 0;
      return BROTLI_TRUE;
    }
  }

  /* Create the last insert-only command. */
  if (s->last_insert_len_ > 0) {
    InitInsertCommand(&s->commands_[s->num_commands_++], s->last_insert_len_);
    s->num_literals_ += s->last_insert_len_;
    s->last_insert_len_ = 0;
  }

  if (!is_last && s->input_pos_ == s->last_flush_pos_) {
    /* We have no new input data and we don't have to finish the stream, so
       nothing to do. */
    *out_size = 0;
    return BROTLI_TRUE;
  }
  assert(s->input_pos_ >= s->last_flush_pos_);
  assert(s->input_pos_ > s->last_flush_pos_ || is_last);
  assert(s->input_pos_ - s->last_flush_pos_ <= 1u << 24);
  {
    const uint32_t metablock_size =
        (uint32_t)(s->input_pos_ - s->last_flush_pos_);
    uint8_t* storage = GetBrotliStorage(s, 2 * metablock_size + 502);
    size_t storage_ix = s->last_byte_bits_;
    if (BROTLI_IS_OOM(m)) return BROTLI_FALSE;
    storage[0] = s->last_byte_;
    WriteMetaBlockInternal(
        m, data, mask, s->last_flush_pos_, metablock_size, is_last,
        &s->params, s->prev_byte_, s->prev_byte2_,
        s->num_literals_, s->num_commands_, s->commands_, s->saved_dist_cache_,
        s->dist_cache_, &storage_ix, storage);
    if (BROTLI_IS_OOM(m)) return BROTLI_FALSE;
    s->last_byte_ = storage[storage_ix >> 3];
    s->last_byte_bits_ = storage_ix & 7u;
    s->last_flush_pos_ = s->input_pos_;
    if (UpdateLastProcessedPos(s)) {
      HashersReset(&s->hashers_, ChooseHasher(&s->params));
    }
    if (s->last_flush_pos_ > 0) {
      s->prev_byte_ = data[((uint32_t)s->last_flush_pos_ - 1) & mask];
    }
    if (s->last_flush_pos_ > 1) {
      s->prev_byte2_ = data[(uint32_t)(s->last_flush_pos_ - 2) & mask];
    }
    s->num_commands_ = 0;
    s->num_literals_ = 0;
    /* Save the state of the distance cache in case we need to restore it for
       emitting an uncompressed block. */
    memcpy(s->saved_dist_cache_, s->dist_cache_, sizeof(s->dist_cache_));
    *output = &storage[0];
    *out_size = storage_ix >> 3;
    return BROTLI_TRUE;
  }
}